

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cxx
# Opt level: O0

void __thiscall
trento::Event::compute
          (Event *this,Nucleus *nucleusA,Nucleus *nucleusB,NucleonCommon *nucleon_common)

{
  function<void_()> *in_RCX;
  long in_RDI;
  Grid *in_stack_000000c8;
  NucleonCommon *in_stack_000000d0;
  Nucleus *in_stack_000000d8;
  Event *in_stack_000000e0;
  Event *in_stack_00000120;
  
  *(undefined4 *)(in_RDI + 0x1b8) = 0;
  compute_nuclear_thickness(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8)
  ;
  compute_nuclear_thickness(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8)
  ;
  std::function<void_()>::operator()(in_RCX);
  compute_observables(in_stack_00000120);
  return;
}

Assistant:

void Event::compute(const Nucleus& nucleusA, const Nucleus& nucleusB,
                    const NucleonCommon& nucleon_common) {
  // Reset npart; compute_nuclear_thickness() increments it.
  npart_ = 0;
  compute_nuclear_thickness(nucleusA, nucleon_common, TA_);
  compute_nuclear_thickness(nucleusB, nucleon_common, TB_);
  compute_reduced_thickness_();
  compute_observables();
}